

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O0

grid_iterator<int> *
idx2::Begin<int>(grid_iterator<int> *__return_storage_ptr__,grid *Grid,volume *Vol)

{
  u64 uVar1;
  grid_iterator<int> *Iter;
  int local_2d4;
  int iStack_2d0;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_2ac;
  int local_280;
  int iStack_27c;
  volume *Vol_local;
  grid *Grid_local;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_164;
  int local_13c;
  int iStack_138;
  int local_118;
  int iStack_114;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_68;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_28;
  
  grid_iterator<int>::grid_iterator(__return_storage_ptr__);
  uVar1 = Grid->Strd;
  local_164._0_4_ = ((int)uVar1 << 0xb) >> 0xb;
  local_164._4_4_ = (int)((long)(uVar1 << 0x16) >> 0x2b);
  (__return_storage_ptr__->S).field_0.field_0.Z = (int)((long)(uVar1 * 2) >> 0x2b);
  (__return_storage_ptr__->S).field_0.field_3.XY.field_0 = local_164;
  uVar1 = (Grid->super_extent).Dims;
  local_118 = ((int)uVar1 << 0xb) >> 0xb;
  iStack_114 = (int)((long)(uVar1 << 0x16) >> 0x2b);
  local_280 = (int)_local_118;
  iStack_27c = (int)((ulong)_local_118 >> 0x20);
  local_28._0_4_ = local_280 * (__return_storage_ptr__->S).field_0.field_0.X;
  local_28._4_4_ = iStack_27c * (__return_storage_ptr__->S).field_0.field_0.Y;
  (__return_storage_ptr__->D).field_0.field_0.Z =
       (int)((long)(uVar1 * 2) >> 0x2b) * (__return_storage_ptr__->S).field_0.field_0.Z;
  (__return_storage_ptr__->D).field_0.field_3.XY.field_0 = local_28;
  local_2ac._0_4_ = 0;
  local_2ac._4_4_ = 0;
  (__return_storage_ptr__->P).field_0.field_0.Z = 0;
  (__return_storage_ptr__->P).field_0.field_3.XY.field_0 = local_2ac;
  uVar1 = Vol->Dims;
  local_68._0_4_ = ((int)uVar1 << 0xb) >> 0xb;
  local_68._4_4_ = (int)((long)(uVar1 << 0x16) >> 0x2b);
  (__return_storage_ptr__->N).field_0.field_0.Z = (int)((long)(uVar1 * 2) >> 0x2b);
  (__return_storage_ptr__->N).field_0.field_3.XY.field_0 = local_68;
  uVar1 = (Grid->super_extent).From;
  local_13c = ((int)uVar1 << 0xb) >> 0xb;
  iStack_138 = (int)((long)(uVar1 << 0x16) >> 0x2b);
  iStack_2d0 = (int)((ulong)_local_13c >> 0x20);
  local_2d4 = (int)_local_13c;
  __return_storage_ptr__->Ptr =
       (int *)((Vol->Buffer).Data +
              ((long)(int)((long)(uVar1 * 2) >> 0x2b) *
               (long)(__return_storage_ptr__->N).field_0.field_0.X *
               (long)(__return_storage_ptr__->N).field_0.field_0.Y +
               (long)iStack_2d0 * (long)(__return_storage_ptr__->N).field_0.field_0.X +
              (long)local_2d4) * 4);
  return __return_storage_ptr__;
}

Assistant:

grid_iterator<t>
Begin(const grid& Grid, const volume& Vol)
{
  grid_iterator<t> Iter;
  Iter.S = Strd(Grid);
  Iter.D = Dims(Grid) * Iter.S;
  Iter.P = v3i(0);
  Iter.N = Dims(Vol);
  Iter.Ptr = (t*)const_cast<byte*>(Vol.Buffer.Data) + Row(Iter.N, From(Grid));
  return Iter;
}